

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

int __thiscall QMetaMethod::revision(QMetaMethod *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  QMetaObjectPrivate *pQVar5;
  QMetaMethod *in_RDI;
  int offset;
  QMetaMethodPrivate *in_stack_ffffffffffffffd0;
  uint *puVar6;
  uint local_4;
  
  if (in_RDI->mobj == (QMetaObject *)0x0) {
    local_4 = 0;
  }
  else {
    uVar3 = Data::flags(&in_RDI->data);
    if ((uVar3 & 0x80) == 0) {
      local_4 = 0;
    }
    else {
      pQVar5 = priv((in_RDI->mobj->d).data);
      if (pQVar5->revision < 0xd) {
        pQVar5 = priv((in_RDI->mobj->d).data);
        iVar1 = pQVar5->methodData;
        pQVar5 = priv((in_RDI->mobj->d).data);
        iVar2 = pQVar5->methodCount;
        anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::get(in_RDI);
        iVar4 = anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::ownMethodIndex
                          (in_stack_ffffffffffffffd0);
        local_4 = (in_RDI->mobj->d).data[iVar1 + iVar2 * 6 + iVar4];
      }
      else {
        puVar6 = (in_RDI->mobj->d).data;
        uVar3 = Data::parameters(&in_RDI->data);
        local_4 = puVar6[uVar3 - 1];
      }
    }
  }
  return local_4;
}

Assistant:

int QMetaMethod::revision() const
{
    if (!mobj)
        return 0;
    if ((data.flags() & MethodRevisioned) == 0)
        return 0;
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    if (priv(mobj->d.data)->revision < 13) {
        // revision number located elsewhere
        int offset = priv(mobj->d.data)->methodData
                     + priv(mobj->d.data)->methodCount * Data::Size
                     + QMetaMethodPrivate::get(this)->ownMethodIndex();
        return mobj->d.data[offset];
    }
#endif

    return mobj->d.data[data.parameters() - 1];
}